

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O3

void CMU462::Collada::ColladaParser::parse_polymesh(XMLElement *xml,PolymeshInfo *polymesh)

{
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *this;
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pfVar3;
  pointer pVVar4;
  iterator iVar5;
  pointer pPVar6;
  size_type sVar7;
  int iVar8;
  char *pcVar9;
  XMLElement *pXVar10;
  XMLElement *pXVar11;
  char *pcVar12;
  XMLElement *this_00;
  mapped_type *pmVar13;
  size_t sVar14;
  iterator iVar15;
  long lVar16;
  double dVar17;
  byte bVar18;
  _Rb_tree_header *p_Var19;
  PolymeshInfo *pPVar20;
  undefined8 extraout_RDX;
  ulong uVar21;
  vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_> *this_01;
  long lVar22;
  undefined8 uVar23;
  ulong uVar24;
  undefined1 *puVar25;
  long lVar26;
  vector<CMU462::Vector2D,_std::allocator<CMU462::Vector2D>_> *pvVar27;
  string s;
  float f;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> vertices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  string vertices_id;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  arr_sources;
  size_t index;
  stringstream ss;
  key_type local_2d0;
  PolymeshInfo *local_2b0;
  value_type local_2a8;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *local_288;
  vector<CMU462::Vector2D,_std::allocator<CMU462::Vector2D>_> *local_280;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> local_278;
  long local_260;
  long local_258;
  long local_250;
  void *local_248;
  iterator iStack_240;
  unsigned_long *local_238;
  undefined8 local_230;
  key_type local_228;
  XMLElement *local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  local_1f0;
  unsigned_long local_1c0;
  long *local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  pcVar9 = tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  pcVar12 = (char *)(polymesh->super_Instance).id._M_string_length;
  strlen(pcVar9);
  std::__cxx11::string::_M_replace((ulong)&(polymesh->super_Instance).id,0,pcVar12,(ulong)pcVar9);
  pcVar9 = tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  pcVar12 = (char *)(polymesh->super_Instance).name._M_string_length;
  strlen(pcVar9);
  std::__cxx11::string::_M_replace((ulong)&(polymesh->super_Instance).name,0,pcVar12,(ulong)pcVar9);
  (polymesh->super_Instance).type = POLYMESH;
  pXVar10 = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,"mesh");
  if (pXVar10 != (XMLElement *)0x0) {
    local_1f0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1f0._M_impl.super__Rb_tree_header._M_header;
    local_1f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1f0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1f0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1f0._M_impl.super__Rb_tree_header._M_header._M_left;
    pXVar11 = tinyxml2::XMLNode::FirstChildElement(&pXVar10->super_XMLNode,"source");
    if (pXVar11 != (XMLElement *)0x0) {
      do {
        pcVar12 = tinyxml2::XMLElement::Attribute(pXVar11,"id",(char *)0x0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,pcVar12,(allocator<char> *)local_1b8);
        this_00 = tinyxml2::XMLNode::FirstChildElement(&pXVar11->super_XMLNode,"float_array");
        if (this_00 != (XMLElement *)0x0) {
          local_278.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_278.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_278.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pcVar12 = tinyxml2::XMLElement::GetText(this_00);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,pcVar12,(allocator<char> *)local_1b8);
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)local_1b8,(string *)&local_2d0,_S_out|_S_in);
          iVar8 = tinyxml2::XMLElement::IntAttribute(this_00,"count");
          if (iVar8 != 0) {
            lVar22 = (long)iVar8;
            do {
              std::istream::_M_extract<float>((float *)local_1b8);
              if (local_278.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_278.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_278,
                           (iterator)
                           local_278.
                           super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(float *)&local_2a8);
              }
              else {
                *(float *)local_278.
                          super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                          _M_impl.super__Vector_impl_data._M_finish = local_2a8.x._0_4_;
                local_278.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     (pointer)((long)local_278.
                                     super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 4);
              }
              lVar22 = lVar22 + -1;
            } while (lVar22 != 0);
          }
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                                  *)&local_1f0,&local_228);
          std::vector<float,_std::allocator<float>_>::operator=
                    (pmVar13,(vector<float,_std::allocator<float>_> *)&local_278);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          if (local_278.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_278.
                            super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_278.
                                  super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_278.
                                  super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        pXVar11 = tinyxml2::XMLNode::NextSiblingElement(&pXVar11->super_XMLNode,"source");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,
                          CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                   local_228.field_2._M_local_buf[0]) + 1);
        }
      } while (pXVar11 != (XMLElement *)0x0);
    }
    local_278.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_278.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    local_228._M_string_length = 0;
    local_228.field_2._M_local_buf[0] = '\0';
    pXVar11 = tinyxml2::XMLNode::FirstChildElement(&pXVar10->super_XMLNode,"vertices");
    if (pXVar11 != (XMLElement *)0x0) {
      pcVar12 = tinyxml2::XMLElement::Attribute(pXVar11,"id",(char *)0x0);
      sVar7 = local_228._M_string_length;
      strlen(pcVar12);
      std::__cxx11::string::_M_replace((ulong)&local_228,0,(char *)sVar7,(ulong)pcVar12);
      pXVar11 = tinyxml2::XMLNode::FirstChildElement(&pXVar11->super_XMLNode,"input");
      local_2b0 = polymesh;
      if (pXVar11 != (XMLElement *)0x0) {
        do {
          pcVar12 = tinyxml2::XMLElement::Attribute(pXVar11,"semantic",(char *)0x0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1b8,pcVar12,(allocator<char> *)&local_2d0);
          iVar8 = std::__cxx11::string::compare((char *)local_1b8);
          if (iVar8 == 0) {
            pcVar12 = tinyxml2::XMLElement::Attribute(pXVar11,"source",(char *)0x0);
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            sVar14 = strlen(pcVar12 + 1);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2d0,pcVar12 + 1,pcVar12 + sVar14 + 1);
            iVar15 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                     ::find(&local_1f0,&local_2d0);
            if ((_Rb_tree_header *)iVar15._M_node == &local_1f0._M_impl.super__Rb_tree_header)
            goto LAB_001680c1;
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                                    *)&local_1f0,&local_2d0);
            lVar22 = (long)(pmVar13->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pmVar13->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start;
            if (lVar22 != 0) {
              uVar21 = 0;
              do {
                pfVar3 = (pmVar13->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                local_2a8.z = (double)pfVar3[uVar21 + 2];
                uVar23 = *(undefined8 *)(pfVar3 + uVar21);
                local_2a8.y = (double)(float)((ulong)uVar23 >> 0x20);
                local_2a8.x = (double)(float)uVar23;
                std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                          (&local_278,&local_2a8);
                uVar21 = uVar21 + 3;
              } while (uVar21 < (ulong)(lVar22 >> 2));
            }
            polymesh = local_2b0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
              polymesh = local_2b0;
            }
          }
          pXVar11 = tinyxml2::XMLNode::NextSiblingElement(&pXVar11->super_XMLNode,"input");
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
          }
        } while (pXVar11 != (XMLElement *)0x0);
      }
      pXVar10 = tinyxml2::XMLNode::FirstChildElement(&pXVar10->super_XMLNode,"polylist");
      if (pXVar10 == (XMLElement *)0x0) {
LAB_00168066:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,
                          CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                   local_228.field_2._M_local_buf[0]) + 1);
        }
        if (local_278.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_278.
                          super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_278.
                                super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_278.
                                super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
        ::~_Rb_tree(&local_1f0);
        return;
      }
      pXVar11 = tinyxml2::XMLNode::FirstChildElement(&pXVar10->super_XMLNode,"input");
      local_208 = pXVar10;
      if (pXVar11 == (XMLElement *)0x0) {
        local_260 = 0;
        bVar18 = 0;
        local_258 = 0;
        local_230 = 0;
        local_250 = 0;
        uVar23 = 0;
      }
      else {
        local_288 = &polymesh->vertices;
        this = &polymesh->normals;
        local_280 = &polymesh->texcoords;
        local_1f8 = 0;
        local_250 = 0;
        local_230 = 0;
        local_258 = 0;
        local_200 = 0;
        local_260 = 0;
        do {
          pcVar12 = tinyxml2::XMLElement::Attribute(pXVar11,"semantic",(char *)0x0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1b8,pcVar12,(allocator<char> *)&local_2d0);
          pcVar12 = tinyxml2::XMLElement::Attribute(pXVar11,"source",(char *)0x0);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          sVar14 = strlen(pcVar12 + 1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d0,pcVar12 + 1,pcVar12 + sVar14 + 1);
          iVar8 = tinyxml2::XMLElement::IntAttribute(pXVar11,"offset");
          lVar22 = (long)iVar8;
          iVar8 = std::__cxx11::string::compare((char *)local_1b8);
          if (iVar8 == 0) {
            if ((local_2d0._M_string_length != local_228._M_string_length) ||
               (((char *)local_2d0._M_string_length != (char *)0x0 &&
                (iVar8 = bcmp(local_2d0._M_dataplus._M_p,local_228._M_dataplus._M_p,
                              local_2d0._M_string_length), iVar8 != 0)))) goto LAB_001680c1;
            std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize
                      (local_288,
                       ((long)local_278.
                              super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_278.
                              super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
            ;
            local_1f8 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
            local_250 = lVar22;
            if (0 < (long)local_278.
                          super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_278.
                          super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                          _M_impl.super__Vector_impl_data._M_start) {
              pVVar4 = (local_288->
                       super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              uVar21 = (ulong)((long)local_278.
                                     super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_278.
                                    super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x18 + 1;
              lVar16 = 0;
              do {
                *(undefined8 *)((long)&pVVar4->z + lVar16) =
                     *(undefined8 *)
                      ((long)&(local_278.
                               super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                               ._M_impl.super__Vector_impl_data._M_start)->z + lVar16);
                puVar1 = (undefined8 *)
                         ((long)&(local_278.
                                  super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->x + lVar16);
                uVar23 = puVar1[1];
                puVar2 = (undefined8 *)((long)&pVVar4->x + lVar16);
                *puVar2 = *puVar1;
                puVar2[1] = uVar23;
                uVar21 = uVar21 - 1;
                lVar16 = lVar16 + 0x18;
              } while (1 < uVar21);
            }
          }
          iVar8 = std::__cxx11::string::compare((char *)local_1b8);
          lVar16 = local_258;
          if (iVar8 == 0) {
            iVar15 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                     ::find(&local_1f0,&local_2d0);
            p_Var19 = &local_1f0._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)iVar15._M_node == p_Var19) goto LAB_001680c1;
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                                    *)&local_1f0,&local_2d0);
            local_230 = CONCAT71((int7)((ulong)p_Var19 >> 8),1);
            lVar26 = (long)(pmVar13->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pmVar13->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start;
            polymesh = local_2b0;
            lVar16 = lVar22;
            if (lVar26 != 0) {
              uVar21 = 0;
              do {
                pfVar3 = (pmVar13->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                local_2a8.z = (double)pfVar3[uVar21 + 2];
                uVar23 = *(undefined8 *)(pfVar3 + uVar21);
                local_2a8.y = (double)(float)((ulong)uVar23 >> 0x20);
                local_2a8.x = (double)(float)uVar23;
                std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                          (this,&local_2a8);
                uVar21 = uVar21 + 3;
                polymesh = local_2b0;
              } while (uVar21 < (ulong)(lVar26 >> 2));
            }
          }
          local_258 = lVar16;
          iVar8 = std::__cxx11::string::compare((char *)local_1b8);
          lVar16 = local_260;
          if (iVar8 == 0) {
            iVar15 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                     ::find(&local_1f0,&local_2d0);
            p_Var19 = &local_1f0._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)iVar15._M_node == p_Var19) goto LAB_001680c1;
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                                    *)&local_1f0,&local_2d0);
            local_200 = CONCAT71((int7)((ulong)p_Var19 >> 8),1);
            lVar26 = (long)(pmVar13->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pmVar13->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start;
            polymesh = local_2b0;
            lVar16 = lVar22;
            if (lVar26 != 0) {
              uVar21 = 0;
              do {
                uVar23 = *(undefined8 *)
                          ((pmVar13->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start + uVar21);
                dVar17 = (double)(float)((ulong)uVar23 >> 0x20);
                local_2a8.y._0_4_ = SUB84(dVar17,0);
                local_2a8.x = (double)(float)uVar23;
                local_2a8.y._4_4_ = (int)((ulong)dVar17 >> 0x20);
                std::vector<CMU462::Vector2D,_std::allocator<CMU462::Vector2D>_>::push_back
                          (local_280,(value_type *)&local_2a8);
                uVar21 = uVar21 + 2;
                polymesh = local_2b0;
              } while (uVar21 < (ulong)(lVar26 >> 2));
            }
          }
          local_260 = lVar16;
          pXVar11 = tinyxml2::XMLNode::NextSiblingElement(&pXVar11->super_XMLNode,"input");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
          }
        } while (pXVar11 != (XMLElement *)0x0);
        bVar18 = (byte)local_200 & 1;
        uVar23 = local_1f8;
      }
      pXVar10 = local_208;
      iVar8 = tinyxml2::XMLElement::IntAttribute(local_208,"count");
      local_288 = (vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
                  CONCAT44(local_288._4_4_,iVar8);
      local_2a8._0_16_ = ZEXT816(0);
      local_2a8.z = 0.0;
      pXVar10 = tinyxml2::XMLNode::FirstChildElement(&pXVar10->super_XMLNode,"vcount");
      if (pXVar10 != (XMLElement *)0x0) {
        pcVar12 = tinyxml2::XMLElement::GetText(pXVar10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d0,pcVar12,(allocator<char> *)local_1b8);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)local_1b8,(string *)&local_2d0,_S_out|_S_in);
        pvVar27 = (vector<CMU462::Vector2D,_std::allocator<CMU462::Vector2D>_> *)
                  (long)(int)local_288;
        bVar18 = ((byte)local_230 & 1) + ((byte)uVar23 & 1) + bVar18;
        local_280 = pvVar27;
        if ((int)local_288 == 0) {
          lVar22 = 0;
        }
        else {
          lVar22 = 0;
          do {
            std::istream::_M_extract<unsigned_long>((ulong *)local_1b8);
            if (local_2a8.y == local_2a8.z) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_2a8,
                         (iterator)local_2a8.y,(unsigned_long *)&local_248);
            }
            else {
              *(void **)local_2a8.y = local_248;
              local_2a8.y = (double)((long)local_2a8.y + 8);
            }
            lVar22 = lVar22 + (long)local_248 * (ulong)bVar18;
            pvVar27 = (vector<CMU462::Vector2D,_std::allocator<CMU462::Vector2D>_> *)
                      ((long)&(((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
                               (pvVar27 + -1))->
                              super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                              )._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
          } while (pvVar27 != (vector<CMU462::Vector2D,_std::allocator<CMU462::Vector2D>_> *)0x0);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        local_248 = (void *)0x0;
        iStack_240._M_current = (unsigned_long *)0x0;
        local_238 = (unsigned_long *)0x0;
        pXVar10 = tinyxml2::XMLNode::FirstChildElement(&local_208->super_XMLNode,"p");
        if (pXVar10 != (XMLElement *)0x0) {
          pcVar12 = tinyxml2::XMLElement::GetText(pXVar10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,pcVar12,(allocator<char> *)local_1b8);
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)local_1b8,(string *)&local_2d0,_S_out|_S_in);
          if (lVar22 != 0) {
            do {
              std::istream::_M_extract<unsigned_long>((ulong *)local_1b8);
              if (iStack_240._M_current == local_238) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_248,
                           iStack_240,&local_1c0);
              }
              else {
                *iStack_240._M_current = local_1c0;
                iStack_240._M_current = iStack_240._M_current + 1;
              }
              lVar22 = lVar22 + -1;
            } while (lVar22 != 0);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          this_01 = &polymesh->polygons;
          std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>::resize
                    (this_01,(size_type)local_280);
          pvVar27 = local_280;
          if ((int)local_288 != 0 && (~(byte)uVar23 & 1) == 0) {
            local_250 = local_250 << 3;
            uVar21 = (ulong)((uint)bVar18 * 8);
            puVar25 = (undefined1 *)0x0;
            pPVar20 = (PolymeshInfo *)0x0;
            dVar17 = local_2a8.x;
            do {
              if (*(long *)((long)dVar17 + (long)puVar25 * 8) != 0) {
                lVar22 = uVar21 * (long)pPVar20 + local_250;
                uVar24 = 0;
                local_2b0 = pPVar20;
                do {
                  pPVar6 = (this_01->
                           super__Vector_base<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>
                           )._M_impl.super__Vector_impl_data._M_start + (long)puVar25;
                  iVar5._M_current =
                       *(pointer *)
                        ((long)&(pPVar6->vertex_indices).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl + 8);
                  if (iVar5._M_current ==
                      *(pointer *)
                       ((long)&(pPVar6->vertex_indices).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl + 0x10)) {
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)pPVar6,iVar5,
                               (unsigned_long *)((long)local_248 + lVar22));
                    dVar17 = local_2a8.x;
                  }
                  else {
                    *iVar5._M_current = *(unsigned_long *)((long)local_248 + lVar22);
                    *(unsigned_long **)
                     ((long)&(pPVar6->vertex_indices).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl + 8) = iVar5._M_current + 1;
                  }
                  uVar24 = uVar24 + 1;
                  lVar22 = lVar22 + uVar21;
                } while (uVar24 < *(ulong *)((long)dVar17 + (long)puVar25 * 8));
                pPVar20 = (PolymeshInfo *)((long)&(local_2b0->super_Instance).type + uVar24);
                pvVar27 = local_280;
              }
              puVar25 = puVar25 + 1;
            } while ((vector<CMU462::Vector2D,_std::allocator<CMU462::Vector2D>_> *)puVar25 !=
                     pvVar27);
          }
          if ((~(byte)local_230 & 1) == 0 && (int)local_288 != 0) {
            local_258 = local_258 << 3;
            uVar21 = (ulong)((uint)bVar18 * 8);
            puVar25 = (undefined1 *)0x0;
            pPVar20 = (PolymeshInfo *)0x0;
            dVar17 = local_2a8.x;
            do {
              if (*(long *)((long)dVar17 + (long)puVar25 * 8) != 0) {
                lVar22 = uVar21 * (long)pPVar20 + local_258;
                uVar24 = 0;
                local_2b0 = pPVar20;
                do {
                  pPVar6 = (this_01->
                           super__Vector_base<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  iVar5._M_current =
                       *(pointer *)
                        ((long)&pPVar6[(long)puVar25].normal_indices.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl + 8);
                  if (iVar5._M_current ==
                      *(pointer *)
                       ((long)&pPVar6[(long)puVar25].normal_indices.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl + 0x10)) {
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                               &pPVar6[(long)puVar25].normal_indices,iVar5,
                               (unsigned_long *)((long)local_248 + lVar22));
                    dVar17 = local_2a8.x;
                  }
                  else {
                    *iVar5._M_current = *(unsigned_long *)((long)local_248 + lVar22);
                    *(unsigned_long **)
                     ((long)&pPVar6[(long)puVar25].normal_indices.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl + 8) = iVar5._M_current + 1;
                  }
                  uVar24 = uVar24 + 1;
                  lVar22 = lVar22 + uVar21;
                } while (uVar24 < *(ulong *)((long)dVar17 + (long)puVar25 * 8));
                pPVar20 = (PolymeshInfo *)((long)&(local_2b0->super_Instance).type + uVar24);
                pvVar27 = local_280;
              }
              puVar25 = puVar25 + 1;
            } while ((vector<CMU462::Vector2D,_std::allocator<CMU462::Vector2D>_> *)puVar25 !=
                     pvVar27);
            if ((int)local_288 != 0) {
              local_260 = local_260 << 3;
              puVar25 = (undefined1 *)0x0;
              lVar22 = 0;
              dVar17 = local_2a8.x;
              do {
                if (*(long *)((long)dVar17 + (long)puVar25 * 8) != 0) {
                  lVar16 = (ulong)bVar18 * 8 * lVar22 + local_260;
                  uVar21 = 0;
                  do {
                    pPVar6 = (this_01->
                             super__Vector_base<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    iVar5._M_current =
                         *(pointer *)
                          ((long)&pPVar6[(long)puVar25].texcoord_indices.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl + 8);
                    if (iVar5._M_current ==
                        *(pointer *)
                         ((long)&pPVar6[(long)puVar25].texcoord_indices.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl + 0x10)) {
                      std::vector<unsigned_long,std::allocator<unsigned_long>>::
                      _M_realloc_insert<unsigned_long_const&>
                                ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                                 &pPVar6[(long)puVar25].texcoord_indices,iVar5,
                                 (unsigned_long *)((long)local_248 + lVar16));
                      dVar17 = local_2a8.x;
                    }
                    else {
                      *iVar5._M_current = *(unsigned_long *)((long)local_248 + lVar16);
                      *(unsigned_long **)
                       ((long)&pPVar6[(long)puVar25].texcoord_indices.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl + 8) = iVar5._M_current + 1;
                    }
                    uVar21 = uVar21 + 1;
                    lVar16 = lVar16 + (ulong)bVar18 * 8;
                  } while (uVar21 < *(ulong *)((long)dVar17 + (long)puVar25 * 8));
                  lVar22 = lVar22 + uVar21;
                  pvVar27 = local_280;
                }
                puVar25 = puVar25 + 1;
              } while ((vector<CMU462::Vector2D,_std::allocator<CMU462::Vector2D>_> *)puVar25 !=
                       pvVar27);
            }
          }
          if (local_248 != (void *)0x0) {
            operator_delete(local_248,(long)local_238 - (long)local_248);
          }
          if ((void *)local_2a8.x != (void *)0x0) {
            operator_delete((void *)local_2a8.x,(long)local_2a8.z - (long)local_2a8.x);
          }
          goto LAB_00168066;
        }
      }
    }
  }
LAB_001680c1:
  exit(1);
}

Assistant:

void ColladaParser::parse_polymesh(XMLElement* xml, PolymeshInfo& polymesh) {

  // name & id
  polymesh.id   = xml->Attribute( "id" );
  polymesh.name = xml->Attribute("name");
  polymesh.type = Instance::POLYMESH;

  XMLElement* e_mesh = xml->FirstChildElement("mesh");
  if (!e_mesh) {
    stat("Error: no mesh data defined in geometry: " << polymesh.id);
    exit(EXIT_FAILURE);
  }

  // array sources
  map< string, vector<float> > arr_sources;
  XMLElement* e_source = e_mesh->FirstChildElement("source");
  while (e_source) {

    // source id
    string source_id = e_source->Attribute("id");

    // source float array - other formats not handled
    XMLElement* e_float_array = e_source->FirstChildElement("float_array");
    if (e_float_array) {

      float f; vector<float> floats;

      // load float array string
      string s = e_float_array->GetText();
      stringstream ss (s);

      // load float array
      size_t num_floats = e_float_array->IntAttribute("count");
      for (size_t i = 0; i < num_floats; ++i) {
        ss >> f; floats.push_back(f);
      }

      // add to array sources
      arr_sources[source_id] = floats;
    }

    // parse next source
    e_source = e_source->NextSiblingElement("source");
  }

  // vertices
  vector<Vector3D> vertices; string vertices_id;
  XMLElement* e_vertices = e_mesh->FirstChildElement("vertices");
  if (!e_vertices) {
    stat("Error: no vertices defined in geometry: " << polymesh.id);
    exit(EXIT_FAILURE);
  } else {
    vertices_id = e_vertices->Attribute("id");
  }

  XMLElement* e_input = e_vertices->FirstChildElement("input");
  while (e_input) {

    // input semantic
    string semantic = e_input->Attribute("semantic");

    // semantic - position
    if (semantic == "POSITION") {
      string source = e_input->Attribute("source") + 1;
      if (arr_sources.find(source) != arr_sources.end()) {
        vector<float>& floats = arr_sources[source];
        size_t num_floats = floats.size();
        for (size_t i = 0; i < num_floats; i += 3) {
          Vector3D v = Vector3D(floats[i], floats[i+1], floats[i+2]);
          vertices.push_back(v);
        }
      } else {
        stat("Error: undefined input source: " << source);
        exit(EXIT_FAILURE);
      }
    }

    // NOTE (sky) : only positions are handled currently

    e_input = e_input->NextSiblingElement("input");
  }

  // polylist
  XMLElement* e_polylist = e_mesh->FirstChildElement("polylist");
  if (e_polylist) {

    // input arrays & array offsets
    bool has_vertex_array   = false; size_t vertex_offset   = 0;
    bool has_normal_array   = false; size_t normal_offset   = 0;
    bool has_texcoord_array = false; size_t texcoord_offset = 0;

    // input arr_sources
    XMLElement* e_input = e_polylist->FirstChildElement("input");
    while (e_input) {

      string semantic = e_input->Attribute("semantic");
      string source   = e_input->Attribute("source") + 1;
      size_t offset   = e_input->IntAttribute("offset");

      // vertex array source
      if (semantic == "VERTEX") {

        has_vertex_array = true;
        vertex_offset = offset;

        if (source == vertices_id) {
          polymesh.vertices.resize(vertices.size());
          copy(vertices.begin(), vertices.end(), polymesh.vertices.begin());
        } else {
          stat("Error: undefined source for VERTEX semantic: " << source);
          exit(EXIT_FAILURE);
        }
      }

      // normal array source
      if (semantic == "NORMAL") {

        has_normal_array = true;
        normal_offset = offset;

        if (arr_sources.find(source) != arr_sources.end()) {
          vector<float>& floats = arr_sources[source];
          size_t num_floats = floats.size();
          for (size_t i = 0; i < num_floats; i += 3) {
            Vector3D n = Vector3D(floats[i], floats[i+1], floats[i+2]);
            polymesh.normals.push_back(n);
          }
        } else {
          stat("Error: undefined source for NORMAL semantic: " << source);
          exit(EXIT_FAILURE);
        }
      }

      // texcoord array source
      if (semantic == "TEXCOORD") {

        has_texcoord_array = true;
        texcoord_offset = offset;

        if (arr_sources.find(source) != arr_sources.end()) {
          vector<float>& floats = arr_sources[source];
          size_t num_floats = floats.size();
          for (size_t i = 0; i < num_floats; i += 2) {
            Vector2D n = Vector2D(floats[i], floats[i+1]);
            polymesh.texcoords.push_back(n);
          }
        } else {
          stat("Error: undefined source for TEXCOORD semantic: " << source);
          exit(EXIT_FAILURE);
        }
      }

      e_input = e_input->NextSiblingElement("input");
    }

    // polygon info
    size_t num_polygons = e_polylist->IntAttribute("count");
    size_t stride = ( has_vertex_array   ? 1 : 0 ) +
                    ( has_normal_array   ? 1 : 0 ) +
                    ( has_texcoord_array ? 1 : 0 ) ;

    // create polygon size array and compute size of index array
    vector<size_t> sizes; size_t num_indices = 0;
    XMLElement* e_vcount = e_polylist->FirstChildElement("vcount");
    if (e_vcount) {

      size_t size;
      string s = e_vcount->GetText();
      stringstream ss (s);

      for (size_t i = 0; i < num_polygons; ++i) {
        ss >> size;
        sizes.push_back(size);
        num_indices += size * stride;
      }

    } else {
      stat("Error: polygon sizes undefined in geometry: " << polymesh.id);
      exit(EXIT_FAILURE);
    }

    // index array
    vector<size_t> indices;
    XMLElement* e_p = e_polylist->FirstChildElement("p");
    if (e_p) {

      size_t index;
      string s = e_p->GetText();
      stringstream ss (s);

      for (size_t i = 0; i < num_indices; ++i) {
        ss >> index;
        indices.push_back(index);
      }

    } else {
      stat("Error: no index array defined in geometry: " << polymesh.id);
      exit(EXIT_FAILURE);
    }

    // create polygons
    polymesh.polygons.resize(num_polygons);

    // vertex array indices
    if (has_vertex_array) {
      size_t k = 0;
      for (size_t i = 0; i < num_polygons; ++i) {
        for (size_t j = 0; j < sizes[i]; ++j) {
          polymesh.polygons[i].vertex_indices.push_back(
            indices[k * stride + vertex_offset]
          );
          k++;
        }
      }
    }

    // normal array indices
    if (has_normal_array) {
      size_t k = 0;
      for (size_t i = 0; i < num_polygons; ++i) {
        for (size_t j = 0; j < sizes[i]; ++j) {
          polymesh.polygons[i].normal_indices.push_back(
            indices[k * stride + normal_offset]
          );
          k++;
        }
      }
    }

    // texcoord array indices
    if (has_normal_array) {
      size_t k = 0;
      for (size_t i = 0; i < num_polygons; ++i) {
        for (size_t j = 0; j < sizes[i]; ++j) {
          polymesh.polygons[i].texcoord_indices.push_back(
            indices[k * stride + texcoord_offset]
          );
          k++;
        }
      }
    }

  }

  // print summary
  stat("  |- " << polymesh);
}